

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3HashClear(Fts3Hash *pH)

{
  undefined8 *puVar1;
  long in_RDI;
  Fts3HashElem *next_elem;
  Fts3HashElem *elem;
  undefined8 *local_10;
  
  local_10 = *(undefined8 **)(in_RDI + 8);
  *(undefined8 *)(in_RDI + 8) = 0;
  fts3HashFree((void *)0x1b2292);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  while (local_10 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*local_10;
    if ((*(char *)(in_RDI + 1) != '\0') && (local_10[3] != 0)) {
      fts3HashFree((void *)0x1b22e7);
    }
    fts3HashFree((void *)0x1b22f1);
    local_10 = puVar1;
  }
  *(undefined4 *)(in_RDI + 4) = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3HashClear(Fts3Hash *pH){
  Fts3HashElem *elem;         /* For looping over all elements of the table */

  assert( pH!=0 );
  elem = pH->first;
  pH->first = 0;
  fts3HashFree(pH->ht);
  pH->ht = 0;
  pH->htsize = 0;
  while( elem ){
    Fts3HashElem *next_elem = elem->next;
    if( pH->copyKey && elem->pKey ){
      fts3HashFree(elem->pKey);
    }
    fts3HashFree(elem);
    elem = next_elem;
  }
  pH->count = 0;
}